

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gla_ManReportMemory(Gla_Man_t *p)

{
  Gla_Obj_t *pGVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  Gla_Obj_t *pGVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int level;
  Rnm_Man_t *p_00;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined4 uVar20;
  double dVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  
  iVar2 = p->pGia->nObjs;
  dVar9 = sat_solver2_memory(p->pSat,1);
  dVar10 = sat_solver2_memory_proof(p->pSat);
  lVar8 = (long)p->nObjs * 0x28 + (long)p->pGia->nObjs * 4;
  auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar12._0_8_ = lVar8;
  auVar12._12_4_ = 0x45300000;
  p_00 = p->pRnm;
  dVar21 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  dVar11 = Rnm_ManMemoryUsage(p_00);
  level = (int)p_00;
  if (0 < (long)p->nObjs) {
    pGVar5 = p->pObjs;
    pGVar1 = pGVar5 + p->nObjs;
    do {
      lVar8 = (long)(pGVar5->vFrames).nCap << 2;
      auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = 0x45300000;
      dVar21 = dVar21 + (auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
      pGVar5 = pGVar5 + 1;
    } while (pGVar5 < pGVar1);
  }
  lVar8 = (long)iVar2 * 0xc;
  auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar15._0_8_ = lVar8;
  auVar15._12_4_ = 0x45300000;
  dVar19 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  lVar8 = (long)p->vAddedNew->nCap << 2;
  auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar16._0_8_ = lVar8;
  auVar16._12_4_ = 0x45300000;
  lVar7 = (long)p->vTemp->nCap << 2;
  auVar17._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar17._0_8_ = lVar7;
  auVar17._12_4_ = 0x45300000;
  lVar6 = (long)p->vAbs->nCap << 2;
  auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar18._0_8_ = lVar6;
  auVar18._12_4_ = 0x45300000;
  dVar21 = dVar9 + dVar19 + dVar10 + dVar21 + dVar11 +
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
           (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 208.0;
  Abc_Print(level,"%s =","Memory: AIG      ");
  bVar3 = NAN(dVar21);
  bVar4 = dVar21 == 0.0;
  uVar13 = SUB84((dVar19 * 100.0) / dVar21,0);
  if ((bVar4) && (!bVar3)) {
    uVar13 = 0;
  }
  uVar22 = SUB84((dVar9 * 100.0) / dVar21,0);
  if ((bVar4) && (!bVar3)) {
    uVar22 = 0;
  }
  uVar23 = SUB84((dVar10 * 100.0) / dVar21,0);
  if ((bVar4) && (!bVar3)) {
    uVar23 = 0;
  }
  uVar24 = SUB84((dVar11 * 100.0) / dVar21,0);
  if ((bVar4) && (!bVar3)) {
    uVar24 = 0;
  }
  uVar20 = SUB84((dVar21 * 100.0) / dVar21,0);
  if ((bVar4) && (!bVar3)) {
    uVar20 = 0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar19 * 9.5367431640625e-07,uVar13);
  Abc_Print(level,"%s =","Memory: SAT      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,uVar22);
  Abc_Print(level,"%s =","Memory: Proof    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar10 * 9.5367431640625e-07,uVar23);
  Abc_Print(level,"%s =","Memory: Map      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Refine   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar11 * 9.5367431640625e-07,uVar24);
  Abc_Print(level,"%s =","Memory: Other    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar21 * 9.5367431640625e-07,uVar20);
  return;
}

Assistant:

void Gla_ManReportMemory( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjs * sizeof(Gla_Obj_t) + Gia_ManObjNum(p->pGia) * sizeof(int);
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memOth = sizeof(Gla_Man_t);
    for ( pGla = p->pObjs; pGla < p->pObjs + p->nObjs; pGla++ )
        memMap += Vec_IntCap(&pGla->vFrames) * sizeof(int);
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memOth += Vec_IntCap(p->vTemp) * sizeof(int);
    memOth += Vec_IntCap(p->vAbs) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memRef + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}